

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapid_json_serial.c
# Opt level: O0

char * rapid_json_serial_print_info(void)

{
  return 
  "Rapid JSON Serial Plugin 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *rapid_json_serial_print_info(void)
{
	static const char rapid_json_serial_info[] =
		"Rapid JSON Serial Plugin " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef RAPID_JSON_SERIAL_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return rapid_json_serial_info;
}